

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O2

bool __thiscall IceCore::Container::Contains(Container *this,udword entry,udword *location)

{
  uint uVar1;
  udword i;
  ulong uVar2;
  
  uVar1 = this->mCurNbEntries;
  uVar2 = 0;
  do {
    if (uVar1 == uVar2) {
LAB_001a4031:
      return uVar2 < uVar1;
    }
    if (this->mEntries[uVar2] == entry) {
      if (location != (udword *)0x0) {
        *location = (udword)uVar2;
      }
      goto LAB_001a4031;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool Container::Contains(udword entry, udword* location) const
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			if(location)	*location = i;
			return true;
		}
	}
	return false;
}